

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

int stbtt_PackFontRangesGatherRects
              (stbtt_pack_context *spc,stbtt_fontinfo *info,stbtt_pack_range *ranges,int num_ranges,
              stbrp_rect *rects)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  int *piVar8;
  float fVar9;
  int local_4c;
  int local_48;
  int x0;
  int y0;
  int x1;
  int y1;
  
  if (num_ranges < 1) {
    x1 = 0;
  }
  else {
    uVar7 = 0;
    x1 = 0;
    _y1 = info;
    do {
      fVar9 = ranges[uVar7].font_size;
      if (fVar9 <= 0.0) {
        fVar9 = -fVar9;
        uVar5 = (uint)(ushort)(*(ushort *)(_y1->data + (long)_y1->head + 0x12) << 8 |
                              *(ushort *)(_y1->data + (long)_y1->head + 0x12) >> 8);
      }
      else {
        puVar3 = _y1->data;
        lVar6 = (long)_y1->hhea;
        uVar5 = ((int)(short)((ushort)puVar3[lVar6 + 4] << 8) | (uint)puVar3[lVar6 + 5]) -
                ((int)(short)((ushort)puVar3[lVar6 + 6] << 8) | (uint)puVar3[lVar6 + 7]);
      }
      ranges[uVar7].h_oversample = (uchar)spc->h_oversample;
      ranges[uVar7].v_oversample = (uchar)spc->v_oversample;
      if (0 < ranges[uVar7].num_chars) {
        piVar8 = &rects[x1].h;
        lVar6 = 0;
        do {
          if (ranges[uVar7].array_of_unicode_codepoints == (int *)0x0) {
            iVar4 = ranges[uVar7].first_unicode_codepoint_in_range + (int)lVar6;
          }
          else {
            iVar4 = ranges[uVar7].array_of_unicode_codepoints[lVar6];
          }
          iVar4 = stbtt_FindGlyphIndex(info,iVar4);
          uVar1 = spc->h_oversample;
          uVar2 = spc->v_oversample;
          stbtt_GetGlyphBitmapBoxSubpixel
                    (info,iVar4,(float)uVar1 * (fVar9 / (float)(int)uVar5),
                     (float)uVar2 * (fVar9 / (float)(int)uVar5),0.0,0.0,&local_4c,&local_48,&x0,&y0)
          ;
          iVar4 = spc->padding;
          piVar8[-1] = (iVar4 + uVar1 + -1 + x0) - local_4c;
          *piVar8 = (iVar4 + uVar2 + -1 + y0) - local_48;
          lVar6 = lVar6 + 1;
          piVar8 = piVar8 + 6;
        } while (lVar6 < ranges[uVar7].num_chars);
        x1 = x1 + (int)lVar6;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uint)num_ranges);
  }
  return x1;
}

Assistant:

STBTT_DEF int stbtt_PackFontRangesGatherRects(stbtt_pack_context *spc, stbtt_fontinfo *info, stbtt_pack_range *ranges, int num_ranges, stbrp_rect *rects)
{
   int i,j,k;

   k=0;
   for (i=0; i < num_ranges; ++i) {
      float fh = ranges[i].font_size;
      float scale = fh > 0 ? stbtt_ScaleForPixelHeight(info, fh) : stbtt_ScaleForMappingEmToPixels(info, -fh);
      ranges[i].h_oversample = (unsigned char) spc->h_oversample;
      ranges[i].v_oversample = (unsigned char) spc->v_oversample;
      for (j=0; j < ranges[i].num_chars; ++j) {
         int x0,y0,x1,y1;
         int codepoint = ranges[i].array_of_unicode_codepoints == NULL ? ranges[i].first_unicode_codepoint_in_range + j : ranges[i].array_of_unicode_codepoints[j];
         int glyph = stbtt_FindGlyphIndex(info, codepoint);
         stbtt_GetGlyphBitmapBoxSubpixel(info,glyph,
                                         scale * spc->h_oversample,
                                         scale * spc->v_oversample,
                                         0,0,
                                         &x0,&y0,&x1,&y1);
         rects[k].w = (stbrp_coord) (x1-x0 + spc->padding + spc->h_oversample-1);
         rects[k].h = (stbrp_coord) (y1-y0 + spc->padding + spc->v_oversample-1);
         ++k;
      }
   }

   return k;
}